

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedWithCleanupFallback
          (SerialArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  CleanupNode *pCVar1;
  ArenaBlock *pAVar2;
  char *ptr;
  char **ppcVar3;
  char **v2;
  LogMessage *pLVar4;
  ArenaBlock *pAVar5;
  bool bVar6;
  size_t local_2e8;
  size_t required;
  _func_void_void_ptr *destructor_local;
  size_t align_local;
  size_t n_local;
  SerialArena *this_local;
  size_t local_2a8;
  size_t local_2a0;
  undefined1 local_288 [16];
  LogMessageFatal local_278 [23];
  Voidify local_261;
  char *local_260;
  string *local_258;
  string *absl_log_internal_check_op_result;
  char *next;
  char *local_240;
  char *ret;
  size_t local_230;
  ulong local_228;
  SerialArena *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  SerialArena *local_200;
  byte local_1e1;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  LogMessageFatal local_1d0 [23];
  Voidify local_1b9;
  string *local_1b8;
  SerialArena *local_1b0;
  char *local_1a8 [2];
  char *end_1;
  byte local_181;
  basic_string_view<char,_std::char_traits<char>_> local_180;
  LogMessageFatal local_170 [23];
  Voidify local_159;
  char *local_158;
  char *local_150;
  string *local_148;
  long local_140;
  char *local_138;
  size_t local_128;
  size_t local_120;
  SerialArena *local_118;
  char *local_110;
  char *local_108;
  ChunkList *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  ChunkList *local_d8;
  byte local_b9;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  LogMessageFatal local_a8 [23];
  Voidify local_91;
  SerialArena *local_90;
  char *local_88;
  CleanupNode *local_80;
  char *end;
  byte local_61;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  CleanupNode *local_38;
  CleanupNode *local_30;
  CleanupNode *local_28;
  long local_20;
  CleanupNode *local_18;
  CleanupNode *local_10;
  
  local_2a8 = align;
  local_2a0 = n;
  if (align < 9) {
    local_2e8 = n + 7 & 0xfffffffffffffff8;
    local_120 = n;
  }
  else {
    this_local = (SerialArena *)ArenaAlignAs(align);
    local_2e8 = ArenaAlign::Padded((ArenaAlign *)&this_local,local_2a0);
  }
  AllocateNewBlock(this,local_2e8);
  local_228 = n + 7 & 0xfffffffffffffff8;
  ret = (char *)destructor;
  local_230 = align;
  local_220 = this;
  local_128 = n;
  next = (char *)ArenaAlignAs(align);
  ptr = SerialArena::ptr(this);
  local_240 = ArenaAlign::CeilDefaultAligned<char>((ArenaAlign *)&next,ptr);
  if (this->limit_ < local_240 + local_228) {
    local_218 = (char *)AllocateAlignedWithCleanupFallback
                                  (this,local_228,local_230,(_func_void_void_ptr *)ret);
  }
  else {
    absl_log_internal_check_op_result = (string *)(local_240 + local_228);
    set_ptr(this,(char *)absl_log_internal_check_op_result);
    local_208 = local_240;
    local_210 = ret;
    local_100 = &this->cleanup_list_;
    local_108 = local_240;
    local_110 = ret;
    local_200 = this;
    local_118 = this;
    if ((this->cleanup_list_).next_ < (this->cleanup_list_).limit_) {
      local_e0 = local_240;
      local_e8 = ret;
      local_f8 = local_240;
      local_f0 = ret;
      pCVar1 = (this->cleanup_list_).next_;
      (this->cleanup_list_).next_ = pCVar1 + 1;
      pCVar1->elem = local_240;
      pCVar1->destructor = (_func_void_void_ptr *)ret;
      local_d8 = local_100;
    }
    else {
      cleanup::ChunkList::AddFallback(local_100,local_240,(_func_void_void_ptr *)ret,this);
    }
    local_b9 = 0;
    bVar6 = true;
    if ((this->cleanup_list_).prefetch_ptr_ != (char *)0x0) {
      bVar6 = (this->cleanup_list_).head_ <= (Chunk *)(this->cleanup_list_).prefetch_ptr_;
    }
    local_90 = this;
    if (!bVar6) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_b8,
                 "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
                );
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
                 ,0x137,local_b8._M_len,local_b8._M_str);
      local_b9 = 1;
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a8);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_91,pLVar4);
    }
    if ((local_b9 & 1) != 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a8);
    }
    local_28 = (this->cleanup_list_).next_;
    local_30 = (this->cleanup_list_).limit_;
    local_38 = (CleanupNode *)(this->cleanup_list_).prefetch_ptr_;
    local_20 = 0x180;
    if (((long)local_38 - (long)local_28 < 0x181) && (local_38 < local_30)) {
      ppcVar3 = std::max<char_const*>((char **)&local_28,(char **)&local_38);
      local_38 = (CleanupNode *)*ppcVar3;
      local_61 = 0;
      if (local_38 == (CleanupNode *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_60,"prefetch_ptr != nullptr");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
                   ,0x123,local_60._M_len,local_60._M_str);
        local_61 = 1;
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_50);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar4);
      }
      if ((local_61 & 1) != 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
      }
      local_88 = (char *)((long)&local_38->elem + local_20);
      ppcVar3 = std::min<char_const*>((char **)&local_30,&local_88);
      local_80 = (CleanupNode *)*ppcVar3;
      for (; local_38 < local_80; local_38 = local_38 + 4) {
        local_10 = local_38;
      }
    }
    (this->cleanup_list_).prefetch_ptr_ = (char *)local_38;
    local_18 = local_38;
    ppcVar3 = absl::lts_20240722::log_internal::GetReferenceableValue<char*>(&this->limit_);
    local_260 = SerialArena::ptr(this);
    v2 = absl::lts_20240722::log_internal::GetReferenceableValue<char*>(&local_260);
    local_258 = absl::lts_20240722::log_internal::Check_GEImpl<char*,char*>
                          (ppcVar3,v2,"limit_ >= ptr()");
    if (local_258 != (string *)0x0) {
      local_288 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_258);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_278,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
                 ,0xf3,local_288._0_8_,local_288._8_8_);
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_278)
      ;
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_261,pLVar4);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_278);
    }
    local_1b8 = absl_log_internal_check_op_result;
    local_1e1 = 0;
    bVar6 = true;
    local_1b0 = this;
    if (this->prefetch_ptr_ != (char *)0x0) {
      pAVar2 = (ArenaBlock *)this->prefetch_ptr_;
      pAVar5 = head(this);
      bVar6 = pAVar5 <= pAVar2;
    }
    if (!bVar6) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1e0,
                 "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
                );
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_1d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
                 ,0x12e,local_1e0._M_len,local_1e0._M_str);
      local_1e1 = 1;
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_1d0)
      ;
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_1b9,pLVar4);
    }
    if ((local_1e1 & 1) != 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_1d0);
    }
    local_150 = this->limit_;
    local_158 = this->prefetch_ptr_;
    local_140 = 0x400;
    local_148 = local_1b8;
    local_138 = local_158;
    if ((long)local_158 - (long)local_1b8 < 0x401) {
      if (local_158 < local_150) {
        ppcVar3 = std::max<char_const*>((char **)&local_148,&local_158);
        local_158 = *ppcVar3;
        local_181 = 0;
        if (local_158 == (char *)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_180,"prefetch_ptr != nullptr");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_170,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
                     ,0x123,local_180._M_len,local_180._M_str);
          local_181 = 1;
          pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                             ((LogMessage *)local_170);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_159,pLVar4);
        }
        if ((local_181 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_170);
        }
        local_1a8[0] = local_158 + local_140;
        ppcVar3 = std::min<char_const*>(&local_150,local_1a8);
        for (; local_158 < *ppcVar3; local_158 = local_158 + 0x40) {
        }
      }
      local_138 = local_158;
    }
    this->prefetch_ptr_ = local_138;
    local_218 = local_240;
  }
  return local_218;
}

Assistant:

PROTOBUF_NOINLINE
void* SerialArena::AllocateAlignedWithCleanupFallback(
    size_t n, size_t align, void (*destructor)(void*)) {
  size_t required = AlignUpTo(n, align);
  AllocateNewBlock(required);
  return AllocateAlignedWithCleanup(n, align, destructor);
}